

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.h
# Opt level: O2

void __thiscall ON_ClippingPlane::ON_ClippingPlane(ON_ClippingPlane *this,ON_ClippingPlane *param_1)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  unsigned_short uVar5;
  unsigned_short uVar6;
  long lVar7;
  ON_ClippingPlane *pOVar8;
  ON_ClippingPlane *pOVar9;
  
  pOVar8 = param_1;
  pOVar9 = this;
  for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pOVar9->m_plane).origin.x = (pOVar8->m_plane).origin.x;
    pOVar8 = (ON_ClippingPlane *)&(pOVar8->m_plane).origin.y;
    pOVar9 = (ON_ClippingPlane *)&(pOVar9->m_plane).origin.y;
  }
  ON_UuidList::ON_UuidList(&this->m_viewport_ids,&param_1->m_viewport_ids);
  bVar2 = param_1->m_depth_enabled;
  bVar3 = param_1->m_participation_lists_enabled;
  cVar4 = param_1->m_reserved;
  this->m_bEnabled = param_1->m_bEnabled;
  this->m_depth_enabled = bVar2;
  this->m_participation_lists_enabled = bVar3;
  this->m_reserved = cVar4;
  uVar5 = (param_1->m_plane_id).Data2;
  uVar6 = (param_1->m_plane_id).Data3;
  uVar1 = *(undefined8 *)(param_1->m_plane_id).Data4;
  (this->m_plane_id).Data1 = (param_1->m_plane_id).Data1;
  (this->m_plane_id).Data2 = uVar5;
  (this->m_plane_id).Data3 = uVar6;
  *(undefined8 *)(this->m_plane_id).Data4 = uVar1;
  ON_ClippingPlaneDataStore::ON_ClippingPlaneDataStore(&this->m_data_store,&param_1->m_data_store);
  return;
}

Assistant:

class ON_CLASS ON_ClippingPlane
{
public:
  ON_ClippingPlane();
  ~ON_ClippingPlane();

  void Default();

  ON_Plane m_plane;
  ON_UuidList m_viewport_ids; //ids of viewports that this clipping plane "clips"
  ON_UUID m_plane_id;
  bool m_bEnabled; // true if this clipping plane is active

  ON_ClippingPlaneInfo ClippingPlaneInfo() const;

  // A distance where the clipping plane does not clip geometry.
  // A positive value is equivalent to placing another clipping plane at a
  // distance from this clipping plane along it's normal and then flipping it
  //
  // The depth must also be enabled to be effective
  double Depth() const;

  // Negative depth values are currently not allowed. If a negative depth value
  // is passed to this function, it will not the the internal depth value
  void SetDepth(double depth);

  // Default is false
  bool DepthEnabled() const;
  void SetDepthEnabled(bool on);

  // Default is false
  bool ParticipationListsEnabled() const;
  void SetParticipationListsEnabled(bool on);

  void SetParticipationLists(
    const ON_SimpleArray<ON_UUID>* objectIds,
    const ON_SimpleArray<int>* layerIndices,
    bool isExclusionList);

  const ON_UuidList* ObjectClipParticipationList() const;
  const ON_SimpleArray<int>* LayerClipParticipationList() const;
  bool ClipParticipationListsAreExclusionLists() const;

  bool Read( class ON_BinaryArchive& );
  bool Write( class ON_BinaryArchive& ) const;

private:
  bool m_depth_enabled = false;
  bool m_participation_lists_enabled = false;
  char m_reserved;
  
  ON_ClippingPlaneDataStore m_data_store;
}